

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_enrich2(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  REF_EDGE ref_edge_00;
  char *pcVar8;
  long lVar9;
  int iVar10;
  REF_INT local_c4;
  REF_EDGE ref_edge;
  REF_INT new_cell;
  REF_INT node;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB global;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 == 0) {
    uVar3 = ref_geom_constrain_all(ref_grid);
    if (uVar3 == 0) {
      uVar3 = ref_edge_create(&ref_edge,ref_grid);
      ref_edge_00 = ref_edge;
      if (uVar3 == 0) {
        lVar9 = (long)ref_edge->n;
        if (lVar9 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xfb4,"ref_geom_enrich2","malloc edge_node of REF_INT negative");
          return 1;
        }
        __ptr = malloc(lVar9 * 4);
        if (__ptr == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xfb4,"ref_geom_enrich2","malloc edge_node of REF_INT NULL");
          return 2;
        }
        for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
          *(undefined4 *)((long)__ptr + lVar5 * 4) = 0xffffffff;
        }
        for (local_c4 = 0; local_c4 < ref_edge_00->n; local_c4 = local_c4 + 1) {
          uVar3 = ref_edge_part(ref_edge_00,local_c4,&part);
          if (uVar3 != 0) {
            uVar7 = (ulong)uVar3;
            pcVar8 = "edge part";
            uVar6 = 0xfb6;
            goto LAB_0015cbaa;
          }
          if (pRVar1->id == part) {
            uVar3 = ref_node_next_global(ref_node,&global);
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              pcVar8 = "next global";
              uVar6 = 0xfb8;
              goto LAB_0015cbaa;
            }
            uVar3 = ref_node_add(ref_node,global,&node);
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              pcVar8 = "add node";
              uVar6 = 0xfb9;
              goto LAB_0015cbaa;
            }
            *(REF_INT *)((long)__ptr + (long)local_c4 * 4) = node;
            uVar3 = ref_node_interpolate_edge
                              (ref_node,ref_edge->e2n[(long)local_c4 * 2],
                               ref_edge->e2n[local_c4 * 2 + 1],0.5,node);
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              pcVar8 = "new reals";
              uVar6 = 0xfbd;
              goto LAB_0015cbaa;
            }
            uVar3 = ref_geom_add_constrain_midnode
                              (ref_grid,ref_edge->e2n[(long)local_c4 * 2],
                               ref_edge->e2n[local_c4 * 2 + 1],0.5,node);
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              pcVar8 = "new geom";
              uVar6 = 0xfc1;
              goto LAB_0015cbaa;
            }
          }
          ref_edge_00 = ref_edge;
        }
        uVar3 = ref_node_shift_new_globals(ref_node);
        if (uVar3 == 0) {
          for (iVar10 = 0; iVar10 < ref_grid->cell[0]->max; iVar10 = iVar10 + 1) {
            RVar4 = ref_cell_nodes(ref_grid->cell[0],iVar10,nodes);
            if (RVar4 == 0) {
              nodes[ref_grid->cell[1]->node_per] = nodes[ref_grid->cell[0]->node_per];
              uVar3 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge01";
                uVar6 = 0xfca;
                goto LAB_0015cbaa;
              }
              nodes[2] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_cell_add(ref_grid->cell[1],nodes,&new_cell);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "add";
                uVar6 = 0xfcc;
                goto LAB_0015cbaa;
              }
            }
          }
          for (iVar10 = 0; iVar10 < ref_grid->cell[3]->max; iVar10 = iVar10 + 1) {
            RVar4 = ref_cell_nodes(ref_grid->cell[3],iVar10,nodes);
            if (RVar4 == 0) {
              nodes[ref_grid->cell[4]->node_per] = nodes[ref_grid->cell[3]->node_per];
              uVar3 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge01";
                uVar6 = 0xfd2;
                goto LAB_0015cbaa;
              }
              nodes[3] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[1],nodes[2],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge12";
                uVar6 = 0xfd4;
                goto LAB_0015cbaa;
              }
              nodes[4] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[2],nodes[0],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge20";
                uVar6 = 0xfd6;
                goto LAB_0015cbaa;
              }
              nodes[5] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_cell_add(ref_grid->cell[4],nodes,&new_cell);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "add";
                uVar6 = 0xfd8;
                goto LAB_0015cbaa;
              }
            }
          }
          for (iVar10 = 0; iVar10 < ref_grid->cell[8]->max; iVar10 = iVar10 + 1) {
            RVar4 = ref_cell_nodes(ref_grid->cell[8],iVar10,nodes);
            if (RVar4 == 0) {
              uVar3 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfdb;
                goto LAB_0015cbaa;
              }
              nodes[4] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[1],nodes[2],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfdd;
                goto LAB_0015cbaa;
              }
              nodes[5] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[0],nodes[2],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfdf;
                goto LAB_0015cbaa;
              }
              nodes[6] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[0],nodes[3],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfe1;
                goto LAB_0015cbaa;
              }
              nodes[7] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[1],nodes[3],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfe3;
                goto LAB_0015cbaa;
              }
              nodes[8] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_edge_with(ref_edge,nodes[2],nodes[3],&local_c4);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "find edge";
                uVar6 = 0xfe5;
                goto LAB_0015cbaa;
              }
              nodes[9] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
              uVar3 = ref_cell_add(ref_grid->cell[0xc],nodes,&new_cell);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar8 = "add";
                uVar6 = 0xfe7;
                goto LAB_0015cbaa;
              }
            }
          }
          free(__ptr);
          uVar3 = ref_edge_free(ref_edge);
          if (uVar3 == 0) {
            for (iVar10 = 0; pRVar2 = ref_grid->cell[0], iVar10 < pRVar2->max; iVar10 = iVar10 + 1)
            {
              if (pRVar2->c2n[(long)iVar10 * (long)pRVar2->size_per] != -1) {
                ref_cell_remove(pRVar2,iVar10);
              }
            }
            for (iVar10 = 0; pRVar2 = ref_grid->cell[3], iVar10 < pRVar2->max; iVar10 = iVar10 + 1)
            {
              if (pRVar2->c2n[(long)iVar10 * (long)pRVar2->size_per] != -1) {
                ref_cell_remove(pRVar2,iVar10);
              }
            }
            for (iVar10 = 0; pRVar2 = ref_grid->cell[8], iVar10 < pRVar2->max; iVar10 = iVar10 + 1)
            {
              if (pRVar2->c2n[(long)iVar10 * (long)pRVar2->size_per] != -1) {
                ref_cell_remove(pRVar2,iVar10);
              }
            }
            return 0;
          }
          uVar7 = (ulong)uVar3;
          pcVar8 = "free edge";
          uVar6 = 0xfeb;
        }
        else {
          uVar7 = (ulong)uVar3;
          pcVar8 = "shift glob";
          uVar6 = 0xfc5;
        }
      }
      else {
        uVar7 = (ulong)uVar3;
        pcVar8 = "edge";
        uVar6 = 0xfb3;
      }
    }
    else {
      uVar7 = (ulong)uVar3;
      pcVar8 = "constrain";
      uVar6 = 0xfb1;
    }
  }
  else {
    uVar7 = (ulong)uVar3;
    pcVar8 = "sync glob";
    uVar6 = 0xfaf;
  }
LAB_0015cbaa:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
         "ref_geom_enrich2",uVar7,pcVar8);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich2(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new reals");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[2] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_ed2(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_tr2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[3] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    nodes[5] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_tr2(ref_grid), nodes, &new_cell), "add");
  }
  each_ref_cell_valid_cell_with_nodes(ref_grid_tet(ref_grid), cell, nodes) {
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge");
    nodes[5] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[2], &edge), "find edge");
    nodes[6] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[3], &edge), "find edge");
    nodes[7] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[3], &edge), "find edge");
    nodes[8] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[3], &edge), "find edge");
    nodes[9] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_te2(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tet(ref_grid), cell) {
    ref_cell_remove(ref_grid_tet(ref_grid), cell);
  }

  return REF_SUCCESS;
}